

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall transaction_tests::test_IsStandard::test_method(test_IsStandard *this)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  span<const_std::byte,_18446744073709551615UL> b_08;
  span<const_std::byte,_18446744073709551615UL> b_09;
  span<const_unsigned_char,_18446744073709551615UL> b_10;
  span<const_unsigned_char,_18446744073709551615UL> b_11;
  span<const_unsigned_char,_18446744073709551615UL> b_12;
  span<const_unsigned_char,_18446744073709551615UL> b_13;
  span<const_unsigned_char,_18446744073709551615UL> b_14;
  span<const_unsigned_char,_18446744073709551615UL> b_15;
  span<const_unsigned_char,_18446744073709551615UL> b_16;
  span<const_unsigned_char,_18446744073709551615UL> b_17;
  span<const_unsigned_char,_18446744073709551615UL> b_18;
  span<const_unsigned_char,_18446744073709551615UL> b_19;
  span<const_unsigned_char,_18446744073709551615UL> b_20;
  span<const_unsigned_char,_18446744073709551615UL> b_21;
  span<const_unsigned_char,_18446744073709551615UL> b_22;
  span<const_unsigned_char,_18446744073709551615UL> b_23;
  span<const_unsigned_char,_18446744073709551615UL> b_24;
  span<const_unsigned_char,_18446744073709551615UL> b_25;
  span<const_unsigned_char,_18446744073709551615UL> b_26;
  span<const_unsigned_char,_18446744073709551615UL> b_27;
  initializer_list<unsigned_char> __l;
  initializer_list<CPubKey> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  CAmount CVar7;
  long lVar8;
  uchar *puVar9;
  reference puVar10;
  CScript *pCVar11;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe378;
  const_iterator in_stack_ffffffffffffe380;
  char *in_stack_ffffffffffffe388;
  allocator_type *in_stack_ffffffffffffe390;
  CMutableTransaction *in_stack_ffffffffffffe398;
  CKey *in_stack_ffffffffffffe3a0;
  undefined4 in_stack_ffffffffffffe3a8;
  opcodetype in_stack_ffffffffffffe3ac;
  CMutableTransaction *in_stack_ffffffffffffe3b0;
  undefined7 in_stack_ffffffffffffe3b8;
  undefined1 in_stack_ffffffffffffe3bf;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffe3c0;
  char *__s;
  undefined4 in_stack_ffffffffffffe3c8;
  undefined4 uVar12;
  int in_stack_ffffffffffffe3cc;
  undefined4 uVar13;
  CMutableTransaction *in_stack_ffffffffffffe3d0;
  CMutableTransaction *t_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe3d8;
  anon_class_1_0_00000001 *this_00;
  array<long,_4UL> *in_stack_ffffffffffffe488;
  CCoinsViewCache *in_stack_ffffffffffffe490;
  FillableSigningProvider *in_stack_ffffffffffffe498;
  int op_1;
  uchar op;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  uchar orig_op;
  int index;
  test_IsStandard *this_local;
  allocator<char> local_1591;
  const_string local_1590 [2];
  lazy_ostream local_1570 [2];
  assertion_result local_1550 [2];
  undefined1 local_1511 [48];
  undefined1 local_14e1;
  allocator<char> local_14b3 [2];
  undefined1 local_14b1;
  allocator<char> local_1483 [2];
  undefined1 local_1481;
  allocator<char> local_1453 [2];
  undefined1 local_1451;
  allocator<char> local_1423 [2];
  undefined1 local_1421;
  allocator<char> local_13f3 [2];
  undefined1 local_13f1;
  allocator<char> local_13c3 [2];
  undefined1 local_13c1;
  allocator<char> local_1393 [2];
  undefined1 local_1391;
  allocator<char> local_1363 [2];
  undefined1 local_1361;
  allocator<char> local_1311;
  direct_or_indirect local_1310 [3];
  undefined1 local_12b1;
  direct_or_indirect local_1288 [3];
  undefined1 local_1229;
  allocator<char> local_11f9;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator prev_pc;
  opcodetype opcode;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> non_push_ops;
  allocator<char> local_1103 [2];
  undefined1 local_1101;
  undefined1 local_10d1;
  allocator<char> local_10a2;
  allocator<char> local_10a1 [24];
  allocator<char> local_1089 [40];
  allocator<char> local_1061 [97];
  undefined8 local_1000;
  allocator<char> local_ff1;
  direct_or_indirect local_ff0 [3];
  direct_or_indirect local_f84 [3];
  allocator<char> local_f19;
  CAmount local_f18;
  allocator<char> local_f09;
  CAmount local_f08;
  allocator<char> local_f00;
  allocator<char> local_eff;
  allocator<char> local_efe;
  allocator<char> local_efd;
  direct_or_indirect local_efc [3];
  CAmount nDustThreshold;
  anon_class_1_0_00000001 CheckIsNotStandard;
  anon_class_1_0_00000001 CheckIsStandard;
  CKey key;
  CMutableTransaction t;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> dummyTransactions;
  CCoinsView coinsDummy;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined1 local_985;
  undefined1 local_984;
  undefined1 local_983;
  undefined1 local_982;
  undefined1 local_981;
  undefined1 local_980;
  undefined1 local_97f;
  undefined1 local_97e;
  undefined1 local_97d;
  undefined1 local_97c;
  undefined1 local_97b;
  undefined1 local_97a;
  undefined1 local_979;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  CCoinsViewCache coins;
  FillableSigningProvider keystore;
  
  local_1000 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffe378);
  CCoinsView::CCoinsView((CCoinsView *)in_stack_ffffffffffffe378);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (CCoinsView *)in_stack_ffffffffffffe3c0,(bool)in_stack_ffffffffffffe3bf);
  local_278 = 21000000;
  uStack_270 = 22000000;
  local_288 = 11000000;
  uStack_280 = 50000000;
  SetupDummyInputs(in_stack_ffffffffffffe498,in_stack_ffffffffffffe490,in_stack_ffffffffffffe488);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe378);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffe398->vin,(size_type)in_stack_ffffffffffffe390);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffe388,(size_type)in_stack_ffffffffffffe380.ptr);
  CMutableTransaction::GetHash(in_stack_ffffffffffffe398);
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_298;
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_290;
  *(undefined8 *)(pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_2a8;
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_2a0;
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  (pvVar5->prevout).n = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_10._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_10._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_10._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe398,
             (size_type)in_stack_ffffffffffffe390);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 90000000;
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffe380.ptr >> 0x38,0));
  CKey::GetPubKey(in_stack_ffffffffffffe3a0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffe390,(CPubKey *)in_stack_ffffffffffffe388);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe388,(PKHash *)in_stack_ffffffffffffe380.ptr);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe378);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe378);
  CheckIsNotStandard = (anon_class_1_0_00000001)0x0;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  CVar7 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffe378);
  nDustThreshold = (CVar7 * 0xb6) / 1000;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,(char (*) [1])in_stack_ffffffffffffe378
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    local_efc[0]._0_4_ = 0x222;
    in_stack_ffffffffffffe388 = "546";
    in_stack_ffffffffffffe380.ptr = (uchar *)local_efc;
    in_stack_ffffffffffffe378 = "nDustThreshold";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_efc[0].direct + 0x14,local_efc[0].direct + 4,0x32f,1,2,&nDustThreshold);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  lVar8 = nDustThreshold + -1;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = lVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_efd);
  CVar7 = nDustThreshold;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = CVar7;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::numeric_limits<unsigned_int>::max();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_efe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_eff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_f00);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe378,0);
  g_dust.nSatoshisPerK = local_f08;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_f09);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x2a2;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  CFeeRate::CFeeRate<unsigned_int>((CFeeRate *)in_stack_ffffffffffffe378,0);
  g_dust.nSatoshisPerK = local_f18;
  local_428 = 0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_f19);
  local_468 = 0;
  uStack_460 = 0;
  local_478 = 0;
  uStack_470 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<161UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_80UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_80UL> *)in_stack_ffffffffffffe380.ptr);
  b._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,(char (*) [1])in_stack_ffffffffffffe378
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    local_f84[0]._0_4_ =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                   ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffe388);
    in_stack_ffffffffffffe388 = "t.vout[0].scriptPubKey.size()";
    in_stack_ffffffffffffe380.ptr = (uchar *)local_f84;
    in_stack_ffffffffffffe378 = "MAX_OP_RETURN_RELAY";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_f84[0].direct + 0x14,local_f84[0].direct + 4,0x358,1,2,&MAX_OP_RETURN_RELAY);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_4e8 = 0;
  uStack_4e0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<163UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_81UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_81UL> *)in_stack_ffffffffffffe380.ptr);
  b_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_00._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_00._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_00);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,(char (*) [1])in_stack_ffffffffffffe378
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    local_ff0[0]._4_4_ = 0x54;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    local_ff0[0]._0_4_ =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                   ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffe388);
    in_stack_ffffffffffffe388 = "t.vout[0].scriptPubKey.size()";
    in_stack_ffffffffffffe380.ptr = (uchar *)local_ff0;
    in_stack_ffffffffffffe378 = "MAX_OP_RETURN_RELAY + 1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_ff0[0].direct + 0x18,local_ff0[0].direct + 8,0x35d,1,2,local_ff0[0].direct + 4)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_ff1);
  local_578 = 0;
  uStack_570 = 0;
  local_588 = 0;
  uStack_580 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<1UL>______>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_0UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_0UL> *)in_stack_ffffffffffffe380.ptr);
  b_01._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_01._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_01._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_01);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_598 = 0;
  uStack_590 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<3UL>___0___>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_1UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_1UL> *)in_stack_ffffffffffffe380.ptr);
  b_02._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_02._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_02._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_02);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<3UL>___1___>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_1UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_1UL> *)in_stack_ffffffffffffe380.ptr);
  b_03._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_03._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_03._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_03);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_5b8 = 0;
  uStack_5b0 = 0;
  local_5c8 = 0;
  uStack_5c0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<3UL>___1___>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_1UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_1UL> *)in_stack_ffffffffffffe380.ptr);
  b_04._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_04._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_04._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_04);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5e8 = 0;
  uStack_5e0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<3UL>___1___>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_1UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_1UL> *)in_stack_ffffffffffffe380.ptr);
  b_05._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_05._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_05._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_05);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,(int64_t)in_stack_ffffffffffffe380.ptr);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<73UL>___255,_255,_255,_255,_255,_255,_255,_255,_255,_255,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_36UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_36UL> *)in_stack_ffffffffffffe380.ptr);
  b_06._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_06._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_06._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_06);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_628 = 0;
  uStack_620 = 0;
  local_638 = 0;
  uStack_630 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1061);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe398,
             (size_type)in_stack_ffffffffffffe390);
  local_668 = 0;
  uStack_660 = 0;
  local_678 = 0;
  uStack_670 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe398,
             (size_type)in_stack_ffffffffffffe390);
  local_688 = 0;
  uStack_680 = 0;
  local_698 = 0;
  uStack_690 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<81UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_40UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_40UL> *)in_stack_ffffffffffffe380.ptr);
  b_07._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_07._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_07._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_07);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<81UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_40UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_40UL> *)in_stack_ffffffffffffe380.ptr);
  b_08._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_08._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_08._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_08);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1089);
  local_748 = 0;
  uStack_740 = 0;
  local_758 = 0;
  uStack_750 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<81UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_40UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (array<std::byte,_40UL> *)in_stack_ffffffffffffe380.ptr);
  b_09._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffe3a8;
  b_09._M_ptr = &in_stack_ffffffffffffe3a0->fCompressed;
  b_09._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffe3ac;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe388,b_09);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  local_798 = 0;
  uStack_790 = 0;
  local_7a8 = 0;
  uStack_7a0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_10a1);
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7e8 = 0;
  uStack_7e0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  local_7f8 = 0;
  uStack_7f0 = 0;
  local_808 = 0;
  uStack_800 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_10a2);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe398,
             (size_type)in_stack_ffffffffffffe390);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 2100000000000000;
  CKey::GetPubKey(in_stack_ffffffffffffe3a0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffe390,(CPubKey *)in_stack_ffffffffffffe388);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe388,(PKHash *)in_stack_ffffffffffffe380.ptr);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe378);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe378);
  local_908 = 0;
  uStack_900 = 0;
  local_918 = 0;
  uStack_910 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  local_10d1 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_11._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_11._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_11._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_11);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_928 = 0;
  uStack_920 = 0;
  local_938 = 0;
  uStack_930 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  local_1101 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_12._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_12._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_12._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_12);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1103);
  local_968 = 0;
  uStack_960 = 0;
  local_978 = 0;
  uStack_970 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_13._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_13._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_13._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_13);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_14._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_14._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_14._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_14);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_15._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_15._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_15._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_15);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_985 = 0x61;
  local_984 = 0x69;
  local_983 = 99;
  local_982 = 0x7b;
  local_981 = 0x6f;
  local_980 = 0x82;
  local_97f = 0x87;
  local_97e = 0x93;
  local_97d = 0x94;
  local_97c = 0xaa;
  local_97b = 0xab;
  local_97a = 0xac;
  local_979 = 0xb1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  __l._M_len._0_4_ = in_stack_ffffffffffffe3c8;
  __l._M_array = (iterator)in_stack_ffffffffffffe3c0;
  __l._M_len._4_4_ = in_stack_ffffffffffffe3cc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),__l,
             (allocator_type *)in_stack_ffffffffffffe3b0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffe380.ptr);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
            ((const_iterator *)in_stack_ffffffffffffe380.ptr,(iterator)in_stack_ffffffffffffe388);
  while( true ) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffe380.ptr);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
              ((const_iterator *)in_stack_ffffffffffffe380.ptr,(iterator)in_stack_ffffffffffffe388);
    bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                      ((const_iterator *)in_stack_ffffffffffffe380.ptr,
                       (const_iterator)in_stack_ffffffffffffe388);
    if (!bVar4) break;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    CScript::GetOp((CScript *)in_stack_ffffffffffffe398,(const_iterator *)in_stack_ffffffffffffe390,
                   (opcodetype *)in_stack_ffffffffffffe388);
    if (((int)opcode < 1) || (0x4e < (int)opcode)) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
                 (size_type)in_stack_ffffffffffffe380.ptr);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffe380.ptr);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
                ((const_iterator *)in_stack_ffffffffffffe380.ptr,(iterator)in_stack_ffffffffffffe388
                );
      ::operator-((const_iterator)in_stack_ffffffffffffe388,in_stack_ffffffffffffe380);
      puVar9 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                         ((const_iterator *)in_stack_ffffffffffffe378);
      uVar1 = *puVar9;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffe380.ptr);
      __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         (in_stack_ffffffffffffe380.ptr);
      while (bVar4 = __gnu_cxx::
                     operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_ffffffffffffe388,
                                (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_ffffffffffffe380.ptr), ((bVar4 ^ 0xffU) & 1) != 0) {
        puVar10 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_ffffffffffffe378);
        uVar2 = *puVar10;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
                   (size_type)in_stack_ffffffffffffe380.ptr);
        puVar9 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            in_stack_ffffffffffffe388,
                            (size_type)((ulong)in_stack_ffffffffffffe380.ptr >> 0x20));
        *puVar9 = uVar2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
                   (char *)in_stack_ffffffffffffe3c0,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8))
        ;
        test_method()::$_1::operator()
                  (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                   (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe378);
        std::allocator<char>::~allocator(&local_11f9);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffe378);
      }
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
                 (size_type)in_stack_ffffffffffffe380.ptr);
      puVar9 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          in_stack_ffffffffffffe388,
                          (size_type)((ulong)in_stack_ffffffffffffe380.ptr >> 0x20));
      *puVar9 = uVar1;
      test_method()::$_0::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
                 (CMutableTransaction *)
                 CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
    }
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe378);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffe398->vin,(size_type)in_stack_ffffffffffffe390);
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_9c8 = 0;
  uStack_9c0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_1229 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_16._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_16._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_16._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_16);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,(char (*) [1])in_stack_ffffffffffffe378
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               in_stack_ffffffffffffe3b0);
    local_1288[0]._4_4_ = GetTransactionWeight((CTransaction *)in_stack_ffffffffffffe378);
    local_1288[0]._0_4_ = 400000;
    in_stack_ffffffffffffe388 = "400000";
    in_stack_ffffffffffffe380.ptr = (uchar *)local_1288;
    in_stack_ffffffffffffe378 = "GetTransactionWeight(CTransaction(t))";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1288[0].direct + 0x18,local_1288[0].direct + 8,0x3b9,1,2,
               local_1288[0].direct + 4);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe378);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  local_a58 = 0;
  uStack_a50 = 0;
  local_a68 = 0;
  uStack_a60 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_12b1 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_17._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_17._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_17._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_17);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,(char (*) [1])in_stack_ffffffffffffe378
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               in_stack_ffffffffffffe3b0);
    local_1310[0]._4_4_ = GetTransactionWeight((CTransaction *)in_stack_ffffffffffffe378);
    local_1310[0]._0_4_ = 0x61a84;
    in_stack_ffffffffffffe388 = "400004";
    in_stack_ffffffffffffe380.ptr = (uchar *)local_1310;
    in_stack_ffffffffffffe378 = "GetTransactionWeight(CTransaction(t))";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1310[0].direct + 0x18,local_1310[0].direct + 8,0x3be,1,2,
               local_1310[0].direct + 4);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe378);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_1311);
  g_bare_multi = true;
  CKey::GetPubKey(in_stack_ffffffffffffe3a0);
  std::allocator<CPubKey>::allocator((allocator<CPubKey> *)in_stack_ffffffffffffe378);
  __l_00._M_len._0_4_ = in_stack_ffffffffffffe3c8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe3c0;
  __l_00._M_len._4_4_ = in_stack_ffffffffffffe3cc;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),__l_00,
             (allocator_type *)in_stack_ffffffffffffe3b0);
  GetScriptForMultisig(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffe388);
  std::allocator<CPubKey>::~allocator((allocator<CPubKey> *)in_stack_ffffffffffffe378);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffe398->vin,(size_type)in_stack_ffffffffffffe390);
  local_b88 = 0;
  uStack_b80 = 0;
  local_b98 = 0;
  uStack_b90 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  local_1361 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_18._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_18._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_18._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_18);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  g_bare_multi = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1363);
  g_bare_multi = true;
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_bd8 = 0;
  uStack_bd0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  local_1391 = 2;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_19._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_19._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_19._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_19);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x240;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x23f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1393);
  local_c08 = 0;
  uStack_c00 = 0;
  local_c18 = 0;
  uStack_c10 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  local_13c1 = 4;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_20._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_20._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_20._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_20);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x2a0;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x29f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_13c3);
  local_c48 = 0;
  uStack_c40 = 0;
  local_c58 = 0;
  uStack_c50 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_13f1 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_21._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_21._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_21._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_21);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x222;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_13f3);
  local_c88 = 0;
  uStack_c80 = 0;
  local_c98 = 0;
  uStack_c90 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_1421 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_22._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_22._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_22._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_22);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x21c;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x21b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1423);
  local_cc8 = 0;
  uStack_cc0 = 0;
  local_cd8 = 0;
  uStack_cd0 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_1451 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_23._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_23._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_23._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_23);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x126;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x125;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1453);
  local_d08 = 0;
  uStack_d00 = 0;
  local_d18 = 0;
  uStack_d10 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_1481 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_24._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_24._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_24._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_24);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x14a;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_1483);
  local_d48 = 0;
  uStack_d40 = 0;
  local_d58 = 0;
  uStack_d50 = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  local_14b1 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
             (size_type)in_stack_ffffffffffffe3a0,(value_type_conflict3 *)in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_25._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_25._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_25._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_25);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x14a;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0x149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
             (char *)in_stack_ffffffffffffe3c0,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()
            (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
             (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(local_14b3);
  for (op_1 = 0x51; op_1 < 0x61; op_1 = op_1 + 1) {
    local_d88 = 0;
    uStack_d80 = 0;
    local_d98 = 0;
    uStack_d90 = 0;
    CScript::CScript((CScript *)in_stack_ffffffffffffe378);
    CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
    local_14e1 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (size_type)in_stack_ffffffffffffe3a0,
               (value_type_conflict3 *)in_stack_ffffffffffffe398,in_stack_ffffffffffffe390);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffe380.ptr);
    b_26._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
    b_26._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
    b_26._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
    CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_26);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr
                      );
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378)
    ;
    CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
    pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                        (size_type)in_stack_ffffffffffffe380.ptr);
    pvVar6->nValue = 0xf0;
    test_method()::$_0::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe3d0,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8))
    ;
    pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                        (size_type)in_stack_ffffffffffffe380.ptr);
    pvVar6->nValue = 0xef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
               (char *)in_stack_ffffffffffffe3c0,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
    test_method()::$_1::operator()
              (in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
               (string *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe378);
    std::allocator<char>::~allocator((allocator<char> *)(local_1511 + 0x2e));
  }
  local_dc8 = 0;
  uStack_dc0 = 0;
  local_dd8 = 0;
  uStack_dd0 = 0;
  this_00 = (anon_class_1_0_00000001 *)&local_dd8;
  CScript::CScript((CScript *)in_stack_ffffffffffffe378);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac);
  t_00 = (CMutableTransaction *)local_1511;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  __l_01._M_len._0_4_ = in_stack_ffffffffffffe3c8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe3c0;
  __l_01._M_len._4_4_ = in_stack_ffffffffffffe3cc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),__l_01,
             (allocator_type *)in_stack_ffffffffffffe3b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe388,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe380.ptr)
  ;
  b_27._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffe3b8;
  b_27._M_ptr = (pointer)in_stack_ffffffffffffe3b0;
  b_27._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffe3bf;
  pCVar11 = CScript::operator<<((CScript *)in_stack_ffffffffffffe398,b_27);
  uVar12 = SUB84(pCVar11,0);
  uVar13 = (undefined4)((ulong)pCVar11 >> 0x20);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
             (size_type)in_stack_ffffffffffffe380.ptr);
  CScript::operator=((CScript *)in_stack_ffffffffffffe388,(CScript *)in_stack_ffffffffffffe380.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffe378);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe378);
  do {
    __s = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
               (const_string *)in_stack_ffffffffffffe3b0,
               CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
               (const_string *)in_stack_ffffffffffffe3a0);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
               (size_type)in_stack_ffffffffffffe380.ptr);
    in_stack_ffffffffffffe3bf = CScript::IsPayToAnchor((CScript *)in_stack_ffffffffffffe388);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe388,
               SUB81((ulong)in_stack_ffffffffffffe380.ptr >> 0x38,0));
    in_stack_ffffffffffffe3b0 = (CMutableTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe380.ptr,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe388,
               (pointer)in_stack_ffffffffffffe380.ptr,(unsigned_long)in_stack_ffffffffffffe378);
    in_stack_ffffffffffffe378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1550,local_1570,local_1590,0x409,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe378);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffe3ac = CONCAT13(bVar4,(int3)in_stack_ffffffffffffe3ac);
  } while (bVar4);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0xf0;
  test_method()::$_0::operator()
            ((anon_class_1_0_00000001 *)t_00,(CMutableTransaction *)CONCAT44(uVar13,uVar12));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe388,
                      (size_type)in_stack_ffffffffffffe380.ptr);
  pvVar6->nValue = 0xef;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar13,uVar12),__s,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  test_method()::$_1::operator()(this_00,t_00,(string *)CONCAT44(uVar13,uVar12));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe378);
  std::allocator<char>::~allocator(&local_1591);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe388);
  CKey::~CKey((CKey *)in_stack_ffffffffffffe378);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe378);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffe388);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_ffffffffffffe378);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffe378);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_IsStandard)
{
    FillableSigningProvider keystore;
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    std::vector<CMutableTransaction> dummyTransactions =
        SetupDummyInputs(keystore, coins, {11*CENT, 50*CENT, 21*CENT, 22*CENT});

    CMutableTransaction t;
    t.vin.resize(1);
    t.vin[0].prevout.hash = dummyTransactions[0].GetHash();
    t.vin[0].prevout.n = 1;
    t.vin[0].scriptSig << std::vector<unsigned char>(65, 0);
    t.vout.resize(1);
    t.vout[0].nValue = 90*CENT;
    CKey key = GenerateRandomKey();
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));

    constexpr auto CheckIsStandard = [](const auto& t) {
        std::string reason;
        BOOST_CHECK(IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK(reason.empty());
    };
    constexpr auto CheckIsNotStandard = [](const auto& t, const std::string& reason_in) {
        std::string reason;
        BOOST_CHECK(!IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK_EQUAL(reason_in, reason);
    };

    CheckIsStandard(t);

    // Check dust with default relay fee:
    CAmount nDustThreshold = 182 * g_dust.GetFeePerK() / 1000;
    BOOST_CHECK_EQUAL(nDustThreshold, 546);
    // dust:
    t.vout[0].nValue = nDustThreshold - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = nDustThreshold;
    CheckIsStandard(t);

    // Disallowed version
    t.version = std::numeric_limits<uint32_t>::max();
    CheckIsNotStandard(t, "version");

    t.version = 0;
    CheckIsNotStandard(t, "version");

    t.version = TX_MAX_STANDARD_VERSION + 1;
    CheckIsNotStandard(t, "version");

    // Allowed version
    t.version = 1;
    CheckIsStandard(t);

    t.version = 2;
    CheckIsStandard(t);

    // Check dust with odd relay fee to verify rounding:
    // nDustThreshold = 182 * 3702 / 1000
    g_dust = CFeeRate(3702);
    // dust:
    t.vout[0].nValue = 674 - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = 674;
    CheckIsStandard(t);
    g_dust = CFeeRate{DUST_RELAY_TX_FEE};

    t.vout[0].scriptPubKey = CScript() << OP_1;
    CheckIsNotStandard(t, "scriptpubkey");

    // MAX_OP_RETURN_RELAY-byte TxoutType::NULL_DATA (standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY, t.vout[0].scriptPubKey.size());
    CheckIsStandard(t);

    // MAX_OP_RETURN_RELAY+1-byte TxoutType::NULL_DATA (non-standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3800"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY + 1, t.vout[0].scriptPubKey.size());
    CheckIsNotStandard(t, "scriptpubkey");

    // Data payload can be encoded in any way...
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << ""_hex;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "00"_hex << "01"_hex;
    CheckIsStandard(t);
    // OP_RESERVED *is* considered to be a PUSHDATA type opcode by IsPushOnly()!
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RESERVED << -1 << 0 << "01"_hex << 2 << 3 << 4 << 5 << 6 << 7 << 8 << 9 << 10 << 11 << 12 << 13 << 14 << 15 << 16;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << 0 << "01"_hex << 2 << "ffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"_hex;
    CheckIsStandard(t);

    // ...so long as it only contains PUSHDATA's
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RETURN;
    CheckIsNotStandard(t, "scriptpubkey");

    // TxoutType::NULL_DATA w/o PUSHDATA
    t.vout.resize(1);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    CheckIsStandard(t);

    // Only one TxoutType::NULL_DATA permitted in all cases
    t.vout.resize(2);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[0].nValue = 0;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].nValue = 0;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    // Check large scriptSig (non-standard if size is >1650 bytes)
    t.vout.resize(1);
    t.vout[0].nValue = MAX_MONEY;
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
    // OP_PUSHDATA2 with len (3 bytes) + data (1647 bytes) = 1650 bytes
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1647, 0); // 1650
    CheckIsStandard(t);

    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1648, 0); // 1651
    CheckIsNotStandard(t, "scriptsig-size");

    // Check scriptSig format (non-standard if there are any other ops than just PUSHs)
    t.vin[0].scriptSig = CScript()
        << OP_TRUE << OP_0 << OP_1NEGATE << OP_16 // OP_n (single byte pushes: n = 1, 0, -1, 16)
        << std::vector<unsigned char>(75, 0)      // OP_PUSHx [...x bytes...]
        << std::vector<unsigned char>(235, 0)     // OP_PUSHDATA1 x [...x bytes...]
        << std::vector<unsigned char>(1234, 0)    // OP_PUSHDATA2 x [...x bytes...]
        << OP_9;
    CheckIsStandard(t);

    const std::vector<unsigned char> non_push_ops = { // arbitrary set of non-push operations
        OP_NOP, OP_VERIFY, OP_IF, OP_ROT, OP_3DUP, OP_SIZE, OP_EQUAL, OP_ADD, OP_SUB,
        OP_HASH256, OP_CODESEPARATOR, OP_CHECKSIG, OP_CHECKLOCKTIMEVERIFY };

    CScript::const_iterator pc = t.vin[0].scriptSig.begin();
    while (pc < t.vin[0].scriptSig.end()) {
        opcodetype opcode;
        CScript::const_iterator prev_pc = pc;
        t.vin[0].scriptSig.GetOp(pc, opcode); // advance to next op
        // for the sake of simplicity, we only replace single-byte push operations
        if (opcode >= 1 && opcode <= OP_PUSHDATA4)
            continue;

        int index = prev_pc - t.vin[0].scriptSig.begin();
        unsigned char orig_op = *prev_pc; // save op
        // replace current push-op with each non-push-op
        for (auto op : non_push_ops) {
            t.vin[0].scriptSig[index] = op;
            CheckIsNotStandard(t, "scriptsig-not-pushonly");
        }
        t.vin[0].scriptSig[index] = orig_op; // restore op
        CheckIsStandard(t);
    }

    // Check tx-size (non-standard if transaction weight is > MAX_STANDARD_TX_WEIGHT)
    t.vin.clear();
    t.vin.resize(2438); // size per input (empty scriptSig): 41 bytes
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(19, 0); // output size: 30 bytes
    // tx header:                12 bytes =>     48 weight units
    // 2438 inputs: 2438*41 = 99958 bytes => 399832 weight units
    //    1 output:              30 bytes =>    120 weight units
    //                      ======================================
    //                                total: 400000 weight units
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400000);
    CheckIsStandard(t);

    // increase output size by one byte, so we end up with 400004 weight units
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(20, 0); // output size: 31 bytes
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400004);
    CheckIsNotStandard(t, "tx-size");

    // Check bare multisig (standard if policy flag g_bare_multi is set)
    g_bare_multi = true;
    t.vout[0].scriptPubKey = GetScriptForMultisig(1, {key.GetPubKey()}); // simple 1-of-1
    t.vin.resize(1);
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(65, 0);
    CheckIsStandard(t);

    g_bare_multi = false;
    CheckIsNotStandard(t, "bare-multisig");
    g_bare_multi = DEFAULT_PERMIT_BAREMULTISIG;

    // Check compressed P2PK outputs dust threshold (must have leading 02 or 03)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(33, 0x02) << OP_CHECKSIG;
    t.vout[0].nValue = 576;
    CheckIsStandard(t);
    t.vout[0].nValue = 575;
    CheckIsNotStandard(t, "dust");

    // Check uncompressed P2PK outputs dust threshold (must have leading 04/06/07)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(65, 0x04) << OP_CHECKSIG;
    t.vout[0].nValue = 672;
    CheckIsStandard(t);
    t.vout[0].nValue = 671;
    CheckIsNotStandard(t, "dust");

    // Check P2PKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_DUP << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUALVERIFY << OP_CHECKSIG;
    t.vout[0].nValue = 546;
    CheckIsStandard(t);
    t.vout[0].nValue = 545;
    CheckIsNotStandard(t, "dust");

    // Check P2SH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUAL;
    t.vout[0].nValue = 540;
    CheckIsStandard(t);
    t.vout[0].nValue = 539;
    CheckIsNotStandard(t, "dust");

    // Check P2WPKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(20, 0);
    t.vout[0].nValue = 294;
    CheckIsStandard(t);
    t.vout[0].nValue = 293;
    CheckIsNotStandard(t, "dust");

    // Check P2WSH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check P2TR outputs dust threshold (Invalid xonly key ok!)
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check future Witness Program versions dust threshold (non-32-byte pushes are undefined for version 1)
    for (int op = OP_1; op <= OP_16; op += 1) {
        t.vout[0].scriptPubKey = CScript() << (opcodetype)op << std::vector<unsigned char>(2, 0);
        t.vout[0].nValue = 240;
        CheckIsStandard(t);

        t.vout[0].nValue = 239;
        CheckIsNotStandard(t, "dust");
    }

    // Check anchor outputs
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>{0x4e, 0x73};
    BOOST_CHECK(t.vout[0].scriptPubKey.IsPayToAnchor());
    t.vout[0].nValue = 240;
    CheckIsStandard(t);
    t.vout[0].nValue = 239;
    CheckIsNotStandard(t, "dust");
}